

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_chr(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int c;
  
  if (nArg < 1) {
    jx9_result_null(pCtx);
  }
  else {
    c = jx9_value_to_int(*apArg);
    jx9_result_string(pCtx,(char *)&c,1);
  }
  return 0;
}

Assistant:

static int jx9Builtin_chr(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int c;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the ASCII value */
	c = jx9_value_to_int(apArg[0]);
	/* Return the specified character */
	jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
	return JX9_OK;
}